

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix
          (ChElasticityKirchhoffIsothropic *this,ChMatrixRef *mC,ChVector<double> *eps,
          ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  double dVar1;
  long lVar2;
  long lVar3;
  PointerType pdVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  char *__function;
  ActualDstType actualDst;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_71;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  SrcEvaluatorType local_58;
  DstEvaluatorType local_48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_30;
  
  if ((mC->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 6) {
    __assert_fail("mC.rows() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                  ,0x74,
                  "virtual void chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  local_70 = z_inf;
  local_68 = z_sup;
  if ((mC->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6) {
    local_30.m_src = &local_58;
    local_58.m_functor.m_other = 0.0;
    local_48.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = (mC->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    local_30.m_dst = &local_48;
    local_48.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value =
         (mC->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_30.m_functor = &local_71;
    uStack_60 = in_XMM1_Qb;
    local_30.m_dstExpr = mC;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_30);
    auVar7._8_8_ = uStack_60;
    auVar7._0_8_ = local_68;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar7,auVar8);
    if ((auVar8._0_8_ != local_70) || (NAN(auVar8._0_8_) || NAN(local_70))) {
      pow(local_68,3.0);
      pow(local_70,3.0);
      __function = 
      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 3, 3, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 3, 3, 1>, Level = 1]"
      ;
    }
    else {
      lVar2 = (mC->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      if ((0 < lVar2) &&
         (lVar3 = (mC->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value, 0 < lVar3)) {
        dVar6 = local_68 - local_70;
        dVar1 = this->m_E;
        dVar10 = this->m_nu;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar10;
        auVar8 = vfnmadd213sd_fma(auVar11,auVar11,ZEXT816(0x3ff0000000000000));
        dVar9 = (dVar6 * dVar1) / auVar8._0_8_;
        pdVar4 = (mC->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
        *pdVar4 = dVar9;
        if ((lVar2 != 1) && (lVar3 != 1)) {
          lVar5 = (mC->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
          pdVar4[lVar5 + 1] = dVar9;
          pdVar4[1] = dVar9 * this->m_nu;
          pdVar4[lVar5] = dVar9 * this->m_nu;
          if ((2 < lVar2) && (2 < lVar3)) {
            dVar10 = dVar10 + 1.0;
            dVar1 = dVar6 * (dVar1 / (dVar10 + dVar10));
            pdVar4[lVar5 * 2 + 2] = dVar1;
            if ((3 < lVar2) && (3 < lVar3)) {
              dVar10 = (dVar6 * dVar6 * dVar9) / 12.0;
              pdVar4[lVar5 * 3 + 3] = dVar10;
              if ((4 < lVar2) && (4 < lVar3)) {
                pdVar4[lVar5 * 4 + 4] = dVar10;
                pdVar4[lVar5 * 3 + 4] = dVar10 * this->m_nu;
                pdVar4[lVar5 * 4 + 3] = dVar10 * this->m_nu;
                if ((5 < lVar2) && (5 < lVar3)) {
                  pdVar4[lVar5 * 5 + 5] = (dVar6 * dVar6 * dVar1) / 12.0;
                  return;
                }
              }
            }
          }
        }
      }
      __function = 
      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
      ;
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,__function);
  }
  __assert_fail("mC.cols() == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                ,0x75,
                "virtual void chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix(ChMatrixRef mC,
                                                        const ChVector<>& eps,
                                                        const ChVector<>& kur,
                                                        const double z_inf,
                                                        const double z_sup,
                                                        const double angle) {
    assert(mC.rows() == 6);
    assert(mC.cols() == 6);

    mC.setZero();

    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;
        mC(0, 0) = C;
		mC(1, 1) = C;
        mC(0, 1) = m_nu * C;
        mC(1, 0) = m_nu * C;
        mC(2, 2) = G * h;
        mC(3, 3) = D;
		mC(4, 4) = D;
        mC(3, 4) = m_nu * D;
        mC(4, 3) = m_nu * D;
        mC(5, 5) = F;
    } else {
        double G = m_E / (2. * (1. + m_nu));
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));
		ChMatrix33<> Q;
		Q(0, 0) = m_E / (1. - m_nu * m_nu);
		Q(0, 1) = m_nu * Q(0, 0);
		Q(0, 2) = 0;
		Q(1, 0) = Q(0, 1);
		Q(1, 1) = Q(0, 0);
		Q(1, 3) = 0;
		Q(2, 0) = 0;
		Q(2, 1) = 0;
		Q(2, 2) = G;
		mC.block<3,3>(0,0) = Q * h1;
		mC.block<3,3>(0,3) = Q * h2;
		mC.block<3,3>(3,0) = Q * h2;
		mC.block<3,3>(3,3) = Q * h3;
    }
}